

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effects_Buffer.cpp
# Opt level: O3

void __thiscall Effects_Buffer::mix_mono(Effects_Buffer *this,blip_sample_t *out_,blargg_long count)

{
  short sVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  
  piVar6 = *(int **)&this->field_0x28;
  iVar3 = *(int *)&this->field_0x34;
  bVar4 = (byte)*(undefined4 *)&this->field_0x38;
  if (1 < (uint)count) {
    lVar7 = 0;
    lVar8 = 0;
    iVar5 = iVar3;
    do {
      iVar2 = (piVar6[lVar8 * 2] - (iVar5 >> (bVar4 & 0x1f))) + iVar5;
      iVar3 = (iVar2 + piVar6[lVar8 * 2 + 1]) - (iVar2 >> (bVar4 & 0x1f));
      uVar9 = -(uint)(-0x7fff0001 < (int)((iVar5 >> 0xe) + 0x8000U ^ 0x80000000));
      uVar10 = -(uint)(-0x7fff0001 < (int)((iVar2 >> 0xe) + 0x8000U ^ 0x80000000));
      uVar9 = ~uVar9 & iVar5 >> 0xe | 0x7fffU - (iVar5 >> 0x1f) & uVar9;
      uVar10 = ~uVar10 & iVar2 >> 0xe | 0x7fffU - (iVar2 >> 0x1f) & uVar10;
      *(uint *)(out_ + lVar8 * 4) = uVar9 << 0x10 | uVar9 & 0xffff;
      *(uint *)((long)(out_ + lVar8 * 4) + 4) = uVar10 << 0x10 | uVar10 & 0xffff;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + -8;
      iVar5 = iVar3;
    } while (count >> 1 != (int)lVar8);
    piVar6 = (int *)((long)piVar6 - lVar7);
    out_ = (blip_sample_t *)((long)out_ - lVar7);
  }
  iVar5 = iVar3;
  if ((count & 1U) != 0) {
    iVar5 = (*piVar6 - (iVar3 >> (bVar4 & 0x1f))) + iVar3;
    sVar1 = (short)(iVar3 >> 0xe);
    *out_ = sVar1;
    out_[1] = sVar1;
    if ((int)sVar1 != iVar3 >> 0xe) {
      sVar1 = 0x7fff - (short)(iVar3 >> 0x1f);
      *out_ = sVar1;
      out_[1] = sVar1;
    }
  }
  *(int *)&this->field_0x34 = iVar5;
  return;
}

Assistant:

void Effects_Buffer::mix_mono( blip_sample_t* out_, blargg_long count )
{
	blip_sample_t* BLIP_RESTRICT out = out_;
	int const bass = BLIP_READER_BASS( bufs [0] );
	BLIP_READER_BEGIN( c, bufs [0] );
	
	// unrolled loop
	for ( blargg_long n = count >> 1; n; --n )
	{
		blargg_long cs0 = BLIP_READER_READ( c );
		BLIP_READER_NEXT( c, bass );
		
		blargg_long cs1 = BLIP_READER_READ( c );
		BLIP_READER_NEXT( c, bass );
		
		if ( (BOOST::int16_t) cs0 != cs0 )
			cs0 = 0x7FFF - (cs0 >> 24);
		((BOOST::uint32_t*) out) [0] = ((BOOST::uint16_t) cs0) | (cs0 << 16);
		
		if ( (BOOST::int16_t) cs1 != cs1 )
			cs1 = 0x7FFF - (cs1 >> 24);
		((BOOST::uint32_t*) out) [1] = ((BOOST::uint16_t) cs1) | (cs1 << 16);
		out += 4;
	}
	
	if ( count & 1 )
	{
		int s = BLIP_READER_READ( c );
		BLIP_READER_NEXT( c, bass );
		out [0] = s;
		out [1] = s;
		if ( (BOOST::int16_t) s != s )
		{
			s = 0x7FFF - (s >> 24);
			out [0] = s;
			out [1] = s;
		}
	}
	
	BLIP_READER_END( c, bufs [0] );
}